

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.h
# Opt level: O0

void __thiscall
dlib::list_box_helper::
list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
::set_double_click_handler
          (list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
           *this,any_function<void_(unsigned_long),_void,_1UL> *eh)

{
  auto_mutex *in_RDI;
  auto_mutex M;
  rmutex *in_stack_ffffffffffffffb8;
  any_function<void_(unsigned_long),_void,_1UL> *in_stack_ffffffffffffffd8;
  any_function<void_(unsigned_long),_void,_1UL> *in_stack_ffffffffffffffe0;
  
  auto_mutex::auto_mutex(in_RDI,in_stack_ffffffffffffffb8);
  any_function<void_(unsigned_long),_void,_1UL>::operator=
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  auto_mutex::~auto_mutex((auto_mutex *)0x451f98);
  return;
}

Assistant:

void set_double_click_handler (
            const any_function<void(unsigned long)>& eh
        ) { auto_mutex M(m); event_handler = eh; }